

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strnid.cc
# Opt level: O1

ASN1_STRING_TABLE * asn1_string_table_get(int nid)

{
  ASN1_STRING_TABLE *pAVar1;
  ASN1_STRING_TABLE key;
  int local_30 [10];
  
  local_30[0] = nid;
  pAVar1 = (ASN1_STRING_TABLE *)bsearch(local_30,tbl_standard,0x13,0x28,table_cmp_void);
  if (pAVar1 == (ASN1_STRING_TABLE *)0x0) {
    CRYPTO_MUTEX_lock_read(&string_tables_lock);
    if (string_tables == (lhash_st_ASN1_STRING_TABLE *)0x0) {
      pAVar1 = (ASN1_STRING_TABLE *)0x0;
    }
    else {
      pAVar1 = (ASN1_STRING_TABLE *)
               OPENSSL_lh_retrieve((_LHASH *)string_tables,local_30,
                                   lh_ASN1_STRING_TABLE_call_hash_func,
                                   lh_ASN1_STRING_TABLE_call_cmp_func);
    }
    CRYPTO_MUTEX_unlock_read(&string_tables_lock);
  }
  return pAVar1;
}

Assistant:

static const ASN1_STRING_TABLE *asn1_string_table_get(int nid) {
  ASN1_STRING_TABLE key;
  key.nid = nid;
  const ASN1_STRING_TABLE *tbl = reinterpret_cast<ASN1_STRING_TABLE *>(
      bsearch(&key, tbl_standard, OPENSSL_ARRAY_SIZE(tbl_standard),
              sizeof(ASN1_STRING_TABLE), table_cmp_void));
  if (tbl != NULL) {
    return tbl;
  }

  CRYPTO_MUTEX_lock_read(&string_tables_lock);
  if (string_tables != NULL) {
    tbl = lh_ASN1_STRING_TABLE_retrieve(string_tables, &key);
  }
  CRYPTO_MUTEX_unlock_read(&string_tables_lock);
  // Note returning |tbl| without the lock is only safe because
  // |ASN1_STRING_TABLE_add| cannot modify or delete existing entries. If we
  // wish to support that, this function must copy the result under a lock.
  return tbl;
}